

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_newc.c
# Opt level: O2

int write_header(archive_write *a,archive_entry *entry)

{
  la_int64_t *plVar1;
  wchar_t wVar2;
  mode_t mVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  archive_string_conv *sc;
  int *piVar7;
  char *pcVar8;
  dev_t dVar9;
  ulong uVar10;
  la_int64_t lVar11;
  time_t v;
  size_t sVar12;
  char *pcVar13;
  int iVar14;
  size_t length;
  int iVar15;
  size_t len;
  char *p;
  la_int64_t *local_c0;
  size_t local_b8;
  char *path;
  char h [110];
  
  plVar1 = (la_int64_t *)a->format_data;
  sc = get_sconv(a);
  wVar2 = _archive_entry_pathname_l(entry,&path,&len,sc);
  if (wVar2 == L'\0') {
    iVar15 = 0;
    local_c0 = plVar1;
LAB_004729a4:
    local_b8 = len;
    h[0] = '\0';
    h[1] = '\0';
    h[2] = '\0';
    h[3] = '\0';
    h[4] = '\0';
    h[5] = '\0';
    h[6] = '\0';
    h[7] = '\0';
    h[8] = '\0';
    h[9] = '\0';
    h[10] = '\0';
    h[0xb] = '\0';
    h[0xc] = '\0';
    h[0xd] = '\0';
    h[0xe] = '\0';
    h[0xf] = '\0';
    h[0x10] = '\0';
    h[0x11] = '\0';
    h[0x12] = '\0';
    h[0x13] = '\0';
    h[0x14] = '\0';
    h[0x15] = '\0';
    h[0x16] = '\0';
    h[0x17] = '\0';
    h[0x18] = '\0';
    h[0x19] = '\0';
    h[0x1a] = '\0';
    h[0x1b] = '\0';
    h[0x1c] = '\0';
    h[0x1d] = '\0';
    h[0x1e] = '\0';
    h[0x1f] = '\0';
    h[0x20] = '\0';
    h[0x21] = '\0';
    h[0x22] = '\0';
    h[0x23] = '\0';
    h[0x24] = '\0';
    h[0x25] = '\0';
    h[0x26] = '\0';
    h[0x27] = '\0';
    h[0x28] = '\0';
    h[0x29] = '\0';
    h[0x2a] = '\0';
    h[0x2b] = '\0';
    h[0x2c] = '\0';
    h[0x2d] = '\0';
    h[0x2e] = '\0';
    h[0x2f] = '\0';
    h[0x30] = '\0';
    h[0x31] = '\0';
    h[0x32] = '\0';
    h[0x33] = '\0';
    h[0x34] = '\0';
    h[0x35] = '\0';
    h[0x36] = '\0';
    h[0x37] = '\0';
    h[0x38] = '\0';
    h[0x39] = '\0';
    h[0x3a] = '\0';
    h[0x3b] = '\0';
    h[0x3c] = '\0';
    h[0x3d] = '\0';
    h[0x3e] = '\0';
    h[0x3f] = '\0';
    h[0x40] = '\0';
    h[0x41] = '\0';
    h[0x42] = '\0';
    h[0x43] = '\0';
    h[0x44] = '\0';
    h[0x45] = '\0';
    h[0x46] = '\0';
    h[0x47] = '\0';
    h[0x48] = '\0';
    h[0x49] = '\0';
    h[0x4a] = '\0';
    h[0x4b] = '\0';
    h[0x4c] = '\0';
    h[0x4d] = '\0';
    h[0x4e] = '\0';
    h[0x4f] = '\0';
    h[0x50] = '\0';
    h[0x51] = '\0';
    h[0x52] = '\0';
    h[0x53] = '\0';
    h[0x54] = '\0';
    h[0x55] = '\0';
    h[0x56] = '\0';
    h[0x57] = '\0';
    h[0x58] = '\0';
    h[0x59] = '\0';
    h[0x5a] = '\0';
    h[0x5b] = '\0';
    h[0x5c] = '\0';
    h[0x5d] = '\0';
    h[0x5e] = '\0';
    h[0x5f] = '\0';
    h[0x60] = '\0';
    h[0x61] = '\0';
    h[0x62] = '\0';
    h[99] = '\0';
    h[100] = '\0';
    h[0x65] = '\0';
    h[0x66] = '\0';
    h[0x67] = '\0';
    h[0x68] = '\0';
    h[0x69] = '\0';
    h[0x6a] = '\0';
    h[0x6b] = '\0';
    h[0x6c] = '\0';
    h[0x6d] = '\0';
    format_hex(0x70701,h,6);
    dVar9 = archive_entry_devmajor(entry);
    format_hex(dVar9,h + 0x3e,8);
    dVar9 = archive_entry_devminor(entry);
    format_hex(dVar9,h + 0x46,8);
    uVar10 = archive_entry_ino64(entry);
    if (0xffffffff < (long)uVar10) {
      archive_set_error(&a->archive,0x22,"large inode number truncated");
      iVar15 = -0x14;
    }
    format_hex(uVar10 & 0xffffffff,h + 6,8);
    mVar3 = archive_entry_mode(entry);
    format_hex((ulong)mVar3,h + 0xe,8);
    lVar11 = archive_entry_uid(entry);
    format_hex(lVar11,h + 0x16,8);
    lVar11 = archive_entry_gid(entry);
    format_hex(lVar11,h + 0x1e,8);
    uVar4 = archive_entry_nlink(entry);
    format_hex((ulong)uVar4,h + 0x26,8);
    mVar3 = archive_entry_filetype(entry);
    if ((mVar3 == 0x6000) || (mVar3 = archive_entry_filetype(entry), mVar3 == 0x2000)) {
      dVar9 = archive_entry_rdevmajor(entry);
      format_hex(dVar9,h + 0x4e,8);
      dVar9 = archive_entry_rdevminor(entry);
    }
    else {
      dVar9 = 0;
      format_hex(0,h + 0x4e,8);
    }
    format_hex(dVar9,h + 0x56,8);
    v = archive_entry_mtime(entry);
    format_hex(v,h + 0x2e,8);
    length = (size_t)((int)local_b8 + 1);
    format_hex(length,h + 0x5e,8);
    format_hex(0,h + 0x66,8);
    mVar3 = archive_entry_filetype(entry);
    if (mVar3 != 0x8000) {
      archive_entry_set_size(entry,0);
    }
    wVar2 = _archive_entry_symlink_l(entry,&p,&len,sc);
    if (wVar2 != L'\0') {
      piVar7 = __errno_location();
      if (*piVar7 == 0xc) {
        pcVar13 = "Can\'t allocate memory for Likname";
        goto LAB_00472b9e;
      }
      pcVar13 = archive_entry_symlink(entry);
      pcVar8 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar13,pcVar8);
      iVar15 = -0x14;
    }
    if ((p == (char *)0x0 || len == 0) || (*p == '\0')) {
      sVar12 = archive_entry_size(entry);
    }
    else {
      sVar12 = strlen(p);
    }
    iVar5 = format_hex(sVar12,h + 0x36,8);
    if (iVar5 == 0) {
      iVar6 = __archive_write_output(a,h,0x6e);
      iVar5 = -0x1e;
      iVar14 = iVar5;
      if ((iVar6 == 0) && (iVar6 = __archive_write_output(a,path,length), iVar6 == 0)) {
        uVar4 = 1U - (int)local_b8 & 3;
        if ((uVar4 == 0) || (iVar6 = __archive_write_output(a,"",(ulong)uVar4), iVar6 == 0)) {
          lVar11 = archive_entry_size(entry);
          pcVar13 = p;
          *local_c0 = lVar11;
          *(uint *)(local_c0 + 1) = -(int)lVar11 & 3;
          iVar14 = iVar15;
          if ((p != (char *)0x0) && (*p != '\0')) {
            sVar12 = strlen(p);
            iVar6 = __archive_write_output(a,pcVar13,sVar12);
            iVar14 = iVar5;
            if (iVar6 == 0) {
              sVar12 = strlen(p);
              iVar5 = __archive_write_output(a,"",(ulong)(-(int)sVar12 & 3));
              iVar14 = -0x1e;
              if (iVar5 == 0) {
                iVar14 = iVar15;
              }
            }
          }
        }
      }
    }
    else {
      archive_set_error(&a->archive,0x22,"File is too large for this format.");
      iVar14 = -0x19;
    }
  }
  else {
    piVar7 = __errno_location();
    if (*piVar7 != 0xc) {
      iVar15 = -0x14;
      local_c0 = plVar1;
      pcVar13 = archive_entry_pathname(entry);
      pcVar8 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar13,pcVar8);
      goto LAB_004729a4;
    }
    pcVar13 = "Can\'t allocate memory for Pathname";
LAB_00472b9e:
    archive_set_error(&a->archive,0xc,pcVar13);
    iVar14 = -0x1e;
  }
  return iVar14;
}

Assistant:

static int
write_header(struct archive_write *a, struct archive_entry *entry)
{
	int64_t ino;
	struct cpio *cpio;
	const char *p, *path;
	int pathlength, ret, ret_final;
	char h[c_header_size];
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;
	size_t len;
	int pad;

	cpio = (struct cpio *)a->format_data;
	ret_final = ARCHIVE_OK;
	sconv = get_sconv(a);

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif

	ret = archive_entry_pathname_l(entry, &path, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	pathlength = (int)len + 1; /* Include trailing null. */

	memset(h, 0, c_header_size);
	format_hex(0x070701, h + c_magic_offset, c_magic_size);
	format_hex(archive_entry_devmajor(entry), h + c_devmajor_offset,
	    c_devmajor_size);
	format_hex(archive_entry_devminor(entry), h + c_devminor_offset,
	    c_devminor_size);

	ino = archive_entry_ino64(entry);
	if (ino > 0xffffffff) {
		archive_set_error(&a->archive, ERANGE,
		    "large inode number truncated");
		ret_final = ARCHIVE_WARN;
	}

	/* TODO: Set ret_final to ARCHIVE_WARN if any of these overflow. */
	format_hex(ino & 0xffffffff, h + c_ino_offset, c_ino_size);
	format_hex(archive_entry_mode(entry), h + c_mode_offset, c_mode_size);
	format_hex(archive_entry_uid(entry), h + c_uid_offset, c_uid_size);
	format_hex(archive_entry_gid(entry), h + c_gid_offset, c_gid_size);
	format_hex(archive_entry_nlink(entry), h + c_nlink_offset, c_nlink_size);
	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR) {
	    format_hex(archive_entry_rdevmajor(entry), h + c_rdevmajor_offset, c_rdevmajor_size);
	    format_hex(archive_entry_rdevminor(entry), h + c_rdevminor_offset, c_rdevminor_size);
	} else {
	    format_hex(0, h + c_rdevmajor_offset, c_rdevmajor_size);
	    format_hex(0, h + c_rdevminor_offset, c_rdevminor_size);
	}
	format_hex(archive_entry_mtime(entry), h + c_mtime_offset, c_mtime_size);
	format_hex(pathlength, h + c_namesize_offset, c_namesize_size);
	format_hex(0, h + c_checksum_offset, c_checksum_size);

	/* Non-regular files don't store bodies. */
	if (archive_entry_filetype(entry) != AE_IFREG)
		archive_entry_set_size(entry, 0);

	/* Symlinks get the link written as the body of the entry. */
	ret = archive_entry_symlink_l(entry, &p, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Likname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_symlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	if (len > 0 && p != NULL  &&  *p != '\0')
		ret = format_hex(strlen(p), h + c_filesize_offset,
		    c_filesize_size);
	else
		ret = format_hex(archive_entry_size(entry),
		    h + c_filesize_offset, c_filesize_size);
	if (ret) {
		archive_set_error(&a->archive, ERANGE,
		    "File is too large for this format.");
		ret_final = ARCHIVE_FAILED;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, h, c_header_size);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	/* Pad pathname to even length. */
	ret = __archive_write_output(a, path, pathlength);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}
	pad = PAD4(pathlength + c_header_size);
	if (pad) {
		ret = __archive_write_output(a, "\0\0\0", pad);
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}

	cpio->entry_bytes_remaining = archive_entry_size(entry);
	cpio->padding = (int)PAD4(cpio->entry_bytes_remaining);

	/* Write the symlink now. */
	if (p != NULL  &&  *p != '\0') {
		ret = __archive_write_output(a, p, strlen(p));
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		pad = PAD4(strlen(p));
		ret = __archive_write_output(a, "\0\0\0", pad);
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}
exit_write_header:
	if (entry_main)
		archive_entry_free(entry_main);
	return (ret_final);
}